

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall json11::Json::Json(Json *this,char *value)

{
  undefined1 local_29;
  JsonString *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  char *local_18;
  
  local_28 = (JsonString *)0x0;
  local_18 = value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<json11::JsonString,std::allocator<json11::JsonString>,char_const*&>
            (&_Stack_20,&local_28,(allocator<json11::JsonString> *)&local_29,&local_18);
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_20._M_pi;
  return;
}

Assistant:

Json::Json(const char * value)         : m_ptr(make_shared<JsonString>(value)) {}